

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O2

ps_latlink_t *
ps_lattice_bestpath(ps_lattice_t *dag,ngram_model_t *lmset,float32 lwf,float32 ascale)

{
  s3wid_t w;
  uint uVar1;
  ps_latnode_t *ppVar2;
  latlink_list_t *plVar3;
  int iVar4;
  int32 iVar5;
  int iVar6;
  ps_latlink_t *ppVar7;
  ps_latlink_s *ppVar8;
  ps_latnode_s *ppVar9;
  uint uVar10;
  ps_latnode_t **pppVar11;
  latlink_list_t **pplVar12;
  ps_latlink_t *ppVar13;
  ngram_model_t *model;
  char *pcVar14;
  bool bVar15;
  bool bVar16;
  int32 w3_wid;
  s3wid_t local_74;
  ps_search_t *local_70;
  int32 n_used;
  float32 local_60;
  uint local_5c;
  ngram_model_t *local_58;
  float32 local_4c;
  uint local_48;
  int32 local_44;
  logmath_t *local_40;
  ps_lattice_t *local_38;
  
  local_40 = dag->lmath;
  local_70 = dag->search;
  pppVar11 = &dag->nodes;
  local_60 = lwf;
  local_58 = lmset;
  local_4c = ascale;
  while (model = local_58, ppVar2 = *pppVar11, ppVar2 != (ps_latnode_t *)0x0) {
    pplVar12 = &ppVar2->exits;
    while (plVar3 = *pplVar12, plVar3 != (latlink_list_t *)0x0) {
      plVar3->link->path_scr = -0x80000000;
      iVar4 = logmath_get_zero(local_40);
      plVar3->link->alpha = iVar4;
      pplVar12 = &plVar3->next;
    }
    pppVar11 = &ppVar2->next;
  }
  pplVar12 = &dag->start->exits;
  while (plVar3 = *pplVar12, plVar3 != (latlink_list_t *)0x0) {
    iVar4 = dict_filler_word(local_70->dict,plVar3->link->to->basewid);
    ppVar7 = plVar3->link;
    if (iVar4 == 0) {
      bVar15 = false;
    }
    else {
      bVar15 = ppVar7->to != dag->end;
    }
    ppVar7->path_scr = ppVar7->ascr;
    if ((model != (ngram_model_t *)0x0) && (!bVar15)) {
      iVar5 = ngram_bg_score(model,ppVar7->to->basewid,local_70->start_wid,&n_used);
      ppVar7 = plVar3->link;
      ppVar7->path_scr = (int)((float)(iVar5 >> 10) * (float)local_60 + (float)ppVar7->path_scr);
    }
    ppVar7->best_prev = (ps_latlink_s *)0x0;
    ppVar7->alpha = 0;
    pplVar12 = &plVar3->next;
  }
  ppVar7 = ps_lattice_traverse_edges(dag,(ps_latnode_t *)0x0,(ps_latnode_t *)0x0);
  local_38 = dag;
  do {
    if (ppVar7 == (ps_latlink_t *)0x0) {
      iVar4 = logmath_get_zero(local_40);
      dag->norm = iVar4;
      pplVar12 = &dag->end->entries;
      uVar10 = 0x80000000;
      ppVar7 = (ps_latlink_t *)0x0;
      do {
        plVar3 = *pplVar12;
        if (plVar3 == (latlink_list_t *)0x0) {
          dag->norm = (int)((float)(dag->final_node_ascr << 10) * (float)local_4c + (float)iVar4);
          pcVar14 = (char *)0x0;
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                  ,0x566,"Bestpath score: %d\n",(ulong)uVar10);
          ppVar2 = dag->end;
          if (-1 < (long)ppVar2->wid) {
            pcVar14 = dag->search->dict->word[ppVar2->wid].word;
          }
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                  ,0x56a,"Normalizer P(O) = alpha(%s:%d:%d) = %d\n",pcVar14,(ulong)(uint)ppVar2->sf,
                  (ulong)(uint)ppVar2->lef,(ulong)(uint)dag->norm);
          return ppVar7;
        }
        w3_wid = plVar3->link->from->basewid;
        iVar4 = dict_filler_word(local_70->dict,w3_wid);
        if (iVar4 != 0) {
          ppVar13 = plVar3->link;
          do {
            if (ppVar13->from == dag->start) break;
            ppVar13 = ppVar13->best_prev;
            if (ppVar13 == (ps_latlink_s *)0x0) goto LAB_0010fd0c;
            w3_wid = ppVar13->from->basewid;
            iVar4 = dict_filler_word(local_70->dict,w3_wid);
          } while (iVar4 != 0);
        }
        if (local_58 == (ngram_model_t *)0x0) {
LAB_0010fd0c:
          iVar5 = 0;
        }
        else {
          iVar5 = ngram_ng_prob(local_58,plVar3->link->to->basewid,&w3_wid,1,&n_used);
        }
        iVar4 = logmath_add(local_40,dag->norm,iVar5 + plVar3->link->alpha);
        dag->norm = iVar4;
        uVar1 = plVar3->link->path_scr;
        if ((int)uVar10 < (int)uVar1) {
          ppVar7 = plVar3->link;
          uVar10 = uVar1;
        }
        pplVar12 = &plVar3->next;
      } while( true );
    }
    w3_wid = ppVar7->from->basewid;
    local_74 = ppVar7->to->basewid;
    iVar4 = dict_filler_word(local_70->dict,w3_wid);
    if (iVar4 == 0) {
      uVar10 = 0;
    }
    else {
      uVar10 = (uint)(ppVar7->from != dag->start);
    }
    iVar4 = dict_filler_word(local_70->dict,local_74);
    if (iVar4 == 0) {
      bVar15 = false;
    }
    else {
      bVar15 = ppVar7->to != dag->end;
    }
    local_44 = 0;
    ppVar8 = ppVar7;
    if ((short)uVar10 == 0) {
      uVar10 = 0;
    }
    else {
      do {
        ppVar13 = ppVar8->best_prev;
        if (ppVar13 == (ps_latlink_t *)0x0) goto LAB_0010faaa;
        w3_wid = ppVar13->from->basewid;
        iVar4 = dict_filler_word(local_70->dict,w3_wid);
        ppVar8 = ppVar13;
      } while ((iVar4 != 0) && (ppVar13->from != dag->start));
      uVar10 = 0;
    }
LAB_0010faaa:
    local_5c = uVar10;
    if (((short)local_5c == 0 && model != (ngram_model_t *)0x0) && !bVar15) {
      local_44 = ngram_ng_prob(model,local_74,&w3_wid,1,&n_used);
    }
    ppVar7->alpha = (int)((float)(ppVar7->ascr << 10) * (float)local_4c + (float)ppVar7->alpha);
    if (bVar15) {
      ppVar9 = (ps_latnode_s *)(ulong)(uint)w3_wid;
      local_74 = w3_wid;
      do {
        ppVar8 = ppVar8->best_prev;
        if (ppVar8 == (ps_latlink_s *)0x0) {
          uVar10 = (uint)CONCAT62((int6)((ulong)ppVar9 >> 0x10),1);
          goto LAB_0010fb4f;
        }
        w3_wid = ppVar8->from->basewid;
        iVar4 = dict_filler_word(local_70->dict,w3_wid);
      } while ((iVar4 != 0) && (ppVar9 = ppVar8->from, ppVar9 != dag->start));
      uVar10 = 0;
LAB_0010fb4f:
      local_48 = local_5c;
      local_5c = uVar10;
    }
    else {
      local_48 = 0;
    }
    pplVar12 = &ppVar7->to->exits;
    while (plVar3 = *pplVar12, plVar3 != (latlink_list_t *)0x0) {
      w = plVar3->link->to->basewid;
      iVar4 = dict_filler_word(local_70->dict,w);
      if (iVar4 == 0) {
        bVar15 = false;
      }
      else {
        bVar15 = plVar3->link->to != dag->end;
      }
      bVar16 = model != (ngram_model_t *)0x0;
      iVar4 = logmath_add(local_40,plVar3->link->alpha,ppVar7->alpha + local_44);
      model = local_58;
      ppVar13 = plVar3->link;
      ppVar13->alpha = iVar4;
      iVar4 = ppVar13->ascr + ppVar7->path_scr;
      if ((!bVar15 && (local_48 & 1) == 0) && bVar16) {
        if ((short)local_5c == 0) {
          iVar6 = ngram_tg_score(local_58,w,local_74,w3_wid,&n_used);
        }
        else {
          iVar6 = ngram_bg_score(local_58,w,local_74,&n_used);
        }
        iVar4 = (int)((float)(iVar6 >> 10) * (float)local_60 + (float)iVar4);
      }
      ppVar13 = plVar3->link;
      if (ppVar13->path_scr < iVar4) {
        ppVar13->path_scr = iVar4;
        ppVar13->best_prev = ppVar7;
      }
      dag = local_38;
      pplVar12 = &plVar3->next;
    }
    ppVar7 = ps_lattice_traverse_next(dag,(ps_latnode_t *)0x0);
  } while( true );
}

Assistant:

ps_latlink_t *
ps_lattice_bestpath(ps_lattice_t *dag, ngram_model_t *lmset,
                    float32 lwf, float32 ascale)
{
    ps_search_t *search;
    ps_latnode_t *node;
    ps_latlink_t *link;
    ps_latlink_t *bestend;
    latlink_list_t *x;
    logmath_t *lmath;
    int32 bestescr;

    search = dag->search;
    lmath = dag->lmath;

    /* Initialize path scores for all links exiting dag->start, and
     * set all other scores to the minimum.  Also initialize alphas to
     * log-zero. */
    for (node = dag->nodes; node; node = node->next) {
        for (x = node->exits; x; x = x->next) {
            x->link->path_scr = MAX_NEG_INT32;
            x->link->alpha = logmath_get_zero(lmath);
        }
    }
    for (x = dag->start->exits; x; x = x->next) {
        int32 n_used;
        int16 to_is_fil;

        to_is_fil = dict_filler_word(ps_search_dict(search), x->link->to->basewid) && x->link->to != dag->end;

        /* Best path points to dag->start, obviously. */
        x->link->path_scr = x->link->ascr;
        if (lmset && !to_is_fil)
            x->link->path_scr += (ngram_bg_score(lmset, x->link->to->basewid,
                                ps_search_start_wid(search), &n_used) >> SENSCR_SHIFT) * lwf;
        x->link->best_prev = NULL;
        /* No predecessors for start links. */
        x->link->alpha = 0;
    }

    /* Traverse the edges in the graph, updating path scores. */
    for (link = ps_lattice_traverse_edges(dag, NULL, NULL);
         link; link = ps_lattice_traverse_next(dag, NULL)) {
        int32 bprob, n_used;
        int32 w3_wid, w2_wid;
        int16 w3_is_fil, w2_is_fil;
        ps_latlink_t *prev_link;

        /* Sanity check, we should not be traversing edges that
         * weren't previously updated, otherwise nasty overflows will result. */
        assert(link->path_scr != MAX_NEG_INT32);

        /* Find word predecessor if from-word is filler */
        w3_wid = link->from->basewid;
        w2_wid = link->to->basewid;
        w3_is_fil = dict_filler_word(ps_search_dict(search), link->from->basewid) && link->from != dag->start;
        w2_is_fil = dict_filler_word(ps_search_dict(search), w2_wid) && link->to != dag->end;
        prev_link = link;

        if (w3_is_fil) {
            while (prev_link->best_prev != NULL) {
                prev_link = prev_link->best_prev;
                w3_wid = prev_link->from->basewid;
                if (!dict_filler_word(ps_search_dict(search), w3_wid) || prev_link->from == dag->start) {
                    w3_is_fil = FALSE;
                    break;
                }
            }
        }

        /* Calculate common bigram probability for all alphas. */
        if (lmset && !w3_is_fil && !w2_is_fil)
            bprob = ngram_ng_prob(lmset, w2_wid, &w3_wid, 1, &n_used);
        else
            bprob = 0;
        /* Add in this link's acoustic score, which was a constant
           factor in previous computations (if any). */
        link->alpha += (link->ascr << SENSCR_SHIFT) * ascale;

        if (w2_is_fil) {
            w2_is_fil = w3_is_fil;
            w3_is_fil = TRUE;
            w2_wid = w3_wid;
            while (prev_link->best_prev != NULL) {
                prev_link = prev_link->best_prev;
                w3_wid = prev_link->from->basewid;
                if (!dict_filler_word(ps_search_dict(search), w3_wid) || prev_link->from == dag->start) {
                    w3_is_fil = FALSE;
                    break;
                }
            }
        }

        /* Update scores for all paths exiting link->to. */
        for (x = link->to->exits; x; x = x->next) {
            int32 score;
            int32 w1_wid;
            int16 w1_is_fil;

            w1_wid = x->link->to->basewid;
            w1_is_fil = dict_filler_word(ps_search_dict(search), w1_wid) && x->link->to != dag->end;

            /* Update alpha with sum of previous alphas. */
            x->link->alpha = logmath_add(lmath, x->link->alpha, link->alpha + bprob);

            /* Update link score with maximum link score. */
            score = link->path_scr + x->link->ascr;
            /* Calculate language score for bestpath if possible */
            if (lmset && !w1_is_fil && !w2_is_fil) {
                if (w3_is_fil)
                    /* partial context available */
                    score += (ngram_bg_score(lmset, w1_wid, w2_wid, &n_used) >> SENSCR_SHIFT) * lwf;
                else
                    /* full context available */
                    score += (ngram_tg_score(lmset, w1_wid, w2_wid, w3_wid, &n_used) >> SENSCR_SHIFT) * lwf;
            }

            if (score BETTER_THAN x->link->path_scr) {
                x->link->path_scr = score;
                x->link->best_prev = link;
            }
        }
    }

    /* Find best link entering final node, and calculate normalizer
     * for posterior probabilities. */
    bestend = NULL;
    bestescr = MAX_NEG_INT32;

    /* Normalizer is the alpha for the imaginary link exiting the
       final node. */
    dag->norm = logmath_get_zero(lmath);
    for (x = dag->end->entries; x; x = x->next) {
        int32 bprob, n_used;
        int32 from_wid;
        int16 from_is_fil;

        from_wid = x->link->from->basewid;
        from_is_fil = dict_filler_word(ps_search_dict(search), from_wid) && x->link->from != dag->start;
        if (from_is_fil) {
            ps_latlink_t *prev_link = x->link;
            while (prev_link->best_prev != NULL) {
                prev_link = prev_link->best_prev;
                from_wid = prev_link->from->basewid;
                if (!dict_filler_word(ps_search_dict(search), from_wid) || prev_link->from == dag->start) {
                    from_is_fil = FALSE;
                    break;
                }
            }
        }

        if (lmset && !from_is_fil)
            bprob = ngram_ng_prob(lmset,
                                  x->link->to->basewid,
                                  &from_wid, 1, &n_used);
        else
            bprob = 0;
        dag->norm = logmath_add(lmath, dag->norm, x->link->alpha + bprob);
        if (x->link->path_scr BETTER_THAN bestescr) {
            bestescr = x->link->path_scr;
            bestend = x->link;
        }
    }
    /* FIXME: floating point... */
    /* FIXME: possible under/overflow!!! */
    dag->norm += (int32)(dag->final_node_ascr << SENSCR_SHIFT) * ascale;

    E_INFO("Bestpath score: %d\n", bestescr);
    E_INFO("Normalizer P(O) = alpha(%s:%d:%d) = %d\n",
           dict_wordstr(dag->search->dict, dag->end->wid),
           dag->end->sf, dag->end->lef,
           dag->norm);
    return bestend;
}